

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O0

err_t AddChild(nodetree *p,nodetree *Child,nodetree *Before)

{
  nodetree **local_28;
  nodetree **i;
  nodetree *Before_local;
  nodetree *Child_local;
  nodetree *p_local;
  
  for (local_28 = &p->Children; (*local_28 != (nodetree *)0x0 && (*local_28 != Before));
      local_28 = &(*local_28)->Next) {
  }
  Child->Parent = p;
  Child->Next = Before;
  *local_28 = Child;
  return 0;
}

Assistant:

static err_t AddChild(nodetree* p,nodetree* Child, nodetree* Before)
{
    nodetree** i;

    for (i=&p->Children;*i;i=&(*i)->Next)
        if (*i == Before)
            break;

    Child->Parent = p;
    Child->Next = Before;
    *i = Child;

    return ERR_NONE;
}